

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O1

void __thiscall DArgs::CollectFiles(DArgs *this,char *param,char *extension)

{
  TArray<FString,_FString> *this_00;
  uint *puVar1;
  char cVar2;
  FString *pFVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  TArray<FString,_FString> work;
  TArray<FString,_FString> local_58;
  size_t local_48;
  FString local_40;
  char *local_38;
  
  local_58.Array = (FString *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  local_38 = extension;
  if (extension == (char *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = strlen(extension);
  }
  this_00 = &this->Argv;
  uVar7 = 1;
  if (1 < (this->Argv).Count) {
    uVar7 = 1;
    do {
      pFVar3 = this_00->Array;
      pcVar4 = pFVar3[uVar7].Chars;
      if ((*pcVar4 == '+') || (*pcVar4 == '-')) break;
      if ((local_48 == 0) ||
         ((local_48 <= *(uint *)(pcVar4 + -0xc) &&
          (iVar5 = strcasecmp(pcVar4 + (*(uint *)(pcVar4 + -0xc) - local_48),local_38), iVar5 == 0))
         )) {
        TArray<FString,_FString>::Grow(&local_58,1);
        FString::AttachToOther(local_58.Array + ((ulong)local_58._8_8_ >> 0x20),pFVar3 + uVar7);
        local_58.Count = local_58.Count + 1;
        TArray<FString,_FString>::Delete(this_00,(uint)uVar7);
      }
      else {
        uVar7 = (ulong)((uint)uVar7 + 1);
      }
    } while ((uint)uVar7 < (this->Argv).Count);
  }
  do {
    do {
      uVar6 = (this->Argv).Count;
      if ((uint)uVar7 < uVar6) {
        pFVar3 = this_00->Array;
        uVar7 = uVar7 & 0xffffffff;
        do {
          iVar5 = strcasecmp(param,pFVar3[uVar7].Chars);
          if (iVar5 == 0) goto LAB_0039e110;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      uVar7 = 0;
LAB_0039e110:
      uVar6 = (uint)uVar7;
      if (uVar6 == 0) {
        if (local_58.Count != 0) {
          FString::FString(&local_40,param);
          TArray<FString,_FString>::Grow(this_00,1);
          FString::AttachToOther((this->Argv).Array + (this->Argv).Count,&local_40);
          puVar1 = &(this->Argv).Count;
          *puVar1 = *puVar1 + 1;
          FString::~FString(&local_40);
          AppendArgs(this,local_58.Count,local_58.Array);
        }
        TArray<FString,_FString>::~TArray(&local_58);
        return;
      }
      TArray<FString,_FString>::Delete(this_00,uVar6);
    } while ((this->Argv).Count <= uVar6);
    do {
      pFVar3 = this_00->Array;
      cVar2 = *pFVar3[uVar7 & 0xffffffff].Chars;
      if ((cVar2 == '+') || (cVar2 == '-')) break;
      TArray<FString,_FString>::Grow(&local_58,1);
      FString::AttachToOther
                (local_58.Array + ((ulong)local_58._8_8_ >> 0x20),pFVar3 + (uVar7 & 0xffffffff));
      local_58.Count = local_58.Count + 1;
      TArray<FString,_FString>::Delete(this_00,uVar6);
    } while (uVar6 < (this->Argv).Count);
  } while( true );
}

Assistant:

void DArgs::CollectFiles(const char *param, const char *extension)
{
	TArray<FString> work;
	unsigned int i;
	size_t extlen = extension == NULL ? 0 : strlen(extension);

	// Step 1: Find suitable arguments before the first switch.
	i = 1;
	while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
	{
		bool useit;

		if (extlen > 0)
		{ // Argument's extension must match.
			size_t len = Argv[i].Len();
			useit = (len >= extlen && stricmp(&Argv[i][len - extlen], extension) == 0);
		}
		else
		{ // Anything will do so long as it's before the first switch.
			useit = true;
		}
		if (useit)
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
		else
		{
			i++;
		}
	}

	// Step 2: Find each occurence of -param and add its arguments to work.
	while ((i = CheckParm(param, i)) > 0)
	{
		Argv.Delete(i);
		while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
	}

	// Optional: Replace short path names with long path names
#ifdef _WIN32
	for (i = 0; i < work.Size(); ++i)
	{
		work[i] = I_GetLongPathName(work[i]);
	}
#endif

	// Step 3: Add work back to Argv, as long as it's non-empty.
	if (work.Size() > 0)
	{
		Argv.Push(param);
		AppendArgs(work.Size(), &work[0]);
	}
}